

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_HeartGenerator.h
# Opt level: O3

void __thiscall soul::HEARTGenerator::visit(HEARTGenerator *this,Connection *conn)

{
  Connection *pCVar1;
  undefined1 in_CL;
  optional<unsigned_long> oVar2;
  optional<long> oVar3;
  undefined1 local_60 [16];
  undefined8 local_50;
  UTF8Reader local_40;
  
  pCVar1 = PoolAllocator::allocate<soul::heart::Connection,soul::CodeLocation&>
                     (&this->module->allocator->pool,&(conn->super_ASTObject).context.location);
  local_60._0_8_ = pCVar1;
  std::
  vector<soul::pool_ref<soul::heart::Connection>,std::allocator<soul::pool_ref<soul::heart::Connection>>>
  ::emplace_back<soul::pool_ref<soul::heart::Connection>>
            ((vector<soul::pool_ref<soul::heart::Connection>,std::allocator<soul::pool_ref<soul::heart::Connection>>>
              *)&this->module->connections,(pool_ref<soul::heart::Connection> *)local_60);
  AST::Connection::getProcessorInstance
            ((Connection *)&stack0xffffffffffffffd0,(conn->source->endpoint).object);
  getOrAddProcessorInstance
            ((HEARTGenerator *)local_60,(pool_ptr<soul::AST::ProcessorInstance> *)this);
  (pCVar1->source).processor.object = (ProcessorInstance *)local_60._0_8_;
  AST::Connection::getProcessorInstance
            ((Connection *)&stack0xffffffffffffffc8,(conn->dest->endpoint).object);
  getOrAddProcessorInstance
            ((HEARTGenerator *)local_60,(pool_ptr<soul::AST::ProcessorInstance> *)this);
  (pCVar1->dest).processor.object = (ProcessorInstance *)local_60._0_8_;
  AST::Connection::getEndpointName_abi_cxx11_
            ((string *)local_60,(Connection *)(conn->source->endpoint).object,(Expression *)0x1,
             (bool)in_CL);
  std::__cxx11::string::operator=((string *)&(pCVar1->source).endpointName,(string *)local_60);
  if ((Connection *)local_60._0_8_ != (Connection *)&stack0xffffffffffffffb0) {
    operator_delete((void *)local_60._0_8_,(ulong)(local_50 + 1));
  }
  oVar2 = AST::Connection::getEndpointIndex((conn->source->endpoint).object);
  (pCVar1->source).endpointIndex.super__Optional_base<unsigned_long,_true,_true>._M_payload.
  super__Optional_payload_base<unsigned_long>._M_payload._M_value =
       oVar2.super__Optional_base<unsigned_long,_true,_true>._M_payload.
       super__Optional_payload_base<unsigned_long>._M_payload;
  (pCVar1->source).endpointIndex.super__Optional_base<unsigned_long,_true,_true>._M_payload.
  super__Optional_payload_base<unsigned_long>._M_engaged =
       oVar2.super__Optional_base<unsigned_long,_true,_true>._M_payload.
       super__Optional_payload_base<unsigned_long>._M_engaged;
  AST::Connection::getEndpointName_abi_cxx11_
            ((string *)local_60,(Connection *)(conn->dest->endpoint).object,(Expression *)0x0,
             (bool)in_CL);
  std::__cxx11::string::operator=((string *)&(pCVar1->dest).endpointName,(string *)local_60);
  if ((Connection *)local_60._0_8_ != (Connection *)&stack0xffffffffffffffb0) {
    operator_delete((void *)local_60._0_8_,(ulong)(local_50 + 1));
  }
  oVar2 = AST::Connection::getEndpointIndex((conn->dest->endpoint).object);
  (pCVar1->dest).endpointIndex.super__Optional_base<unsigned_long,_true,_true>._M_payload.
  super__Optional_payload_base<unsigned_long>._M_payload._M_value =
       oVar2.super__Optional_base<unsigned_long,_true,_true>._M_payload.
       super__Optional_payload_base<unsigned_long>._M_payload;
  (pCVar1->dest).endpointIndex.super__Optional_base<unsigned_long,_true,_true>._M_payload.
  super__Optional_payload_base<unsigned_long>._M_engaged =
       oVar2.super__Optional_base<unsigned_long,_true,_true>._M_payload.
       super__Optional_payload_base<unsigned_long>._M_engaged;
  pCVar1->interpolationType = conn->interpolationType;
  local_40.data = (char *)(conn->delayLength).object;
  oVar3 = getDelayLength((pool_ptr<soul::AST::Expression> *)&stack0xffffffffffffffc0);
  (pCVar1->delayLength).super__Optional_base<long,_true,_true>._M_payload.
  super__Optional_payload_base<long>._M_payload._M_value =
       oVar3.super__Optional_base<long,_true,_true>._M_payload.super__Optional_payload_base<long>.
       _M_payload;
  (pCVar1->delayLength).super__Optional_base<long,_true,_true>._M_payload.
  super__Optional_payload_base<long>._M_engaged =
       oVar3.super__Optional_base<long,_true,_true>._M_payload.super__Optional_payload_base<long>.
       _M_engaged;
  return;
}

Assistant:

void visit (AST::Connection& conn) override
    {
        auto& c = module.allocate<heart::Connection> (conn.context.location);
        module.connections.push_back (c);

        c.source.processor      = getOrAddProcessorInstance (conn.getSourceProcessor());
        c.dest.processor        = getOrAddProcessorInstance (conn.getDestProcessor());
        c.source.endpointName   = conn.getSourceEndpointName();
        c.source.endpointIndex  = conn.getSourceEndpointIndex();
        c.dest.endpointName     = conn.getDestEndpointName();
        c.dest.endpointIndex    = conn.getDestEndpointIndex();
        c.interpolationType     = conn.interpolationType;
        c.delayLength           = getDelayLength (conn.delayLength);
    }